

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

int wabt::OptionParser::Match(char *s,string *full,bool has_argument)

{
  char cVar1;
  char cVar2;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    cVar1 = (full->_M_dataplus)._M_p[iVar3];
    cVar2 = s[iVar3];
    if (cVar1 == '\0') {
      if (cVar2 == '\0') {
        iVar3 = iVar3 + 1;
      }
      else {
        if (!has_argument) {
          iVar3 = -1;
        }
        if (cVar2 != '=') {
          iVar3 = -1;
        }
      }
      return iVar3;
    }
    if (cVar2 == '\0') break;
    if (cVar2 != cVar1) {
      return -1;
    }
    iVar3 = iVar3 + 1;
  }
  return iVar3;
}

Assistant:

int OptionParser::Match(const char* s,
                        const std::string& full,
                        bool has_argument) {
  int i;
  for (i = 0;; i++) {
    if (full[i] == '\0') {
      // Perfect match. Return +1, so it will be preferred over a longer option
      // with the same prefix.
      if (s[i] == '\0') {
        return i + 1;
      }

      // We want to fail if s is longer than full, e.g. --foobar vs. --foo.
      // However, if s ends with an '=', it's OK.
      if (!(has_argument && s[i] == '=')) {
        return -1;
      }
      break;
    }
    if (s[i] == '\0') {
      break;
    }
    if (s[i] != full[i]) {
      return -1;
    }
  }
  return i;
}